

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O3

bool __thiscall
CppJieba::MPSegment::_cut
          (MPSegment *this,SegmentContext *segContext,
          vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *res)

{
  value_type *__x;
  int iVar1;
  ulong uVar2;
  pointer pSVar3;
  ulong uVar4;
  TrieNodeInfo nodeInfo;
  value_type local_78;
  
  pSVar3 = (segContext->
           super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((segContext->super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    uVar4 = 0;
    do {
      __x = pSVar3[uVar4].pInfo;
      if (__x == (value_type *)0x0) {
        local_78.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.freq = 0;
        local_78.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.tag._M_dataplus._M_p = (pointer)&local_78.tag.field_2;
        local_78.tag._M_string_length = 0;
        local_78.tag.field_2._M_local_buf[0] = '\0';
        local_78.logFreq = 0.0;
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_78,(iterator)0x0,
                   &pSVar3[uVar4].uniCh);
        local_78.freq = 0;
        local_78.logFreq = (this->_trie)._minLogFreq;
        std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                  (res,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.tag._M_dataplus._M_p != &local_78.tag.field_2) {
          operator_delete(local_78.tag._M_dataplus._M_p);
        }
        if (local_78.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.word.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        iVar1 = 1;
      }
      else {
        std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                  (res,__x);
        iVar1 = (int)((ulong)((long)(__x->word).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(__x->word).
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 1);
      }
      uVar4 = (ulong)(uint)((int)uVar4 + iVar1);
      pSVar3 = (segContext->
               super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(segContext->
                     super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 4) *
              -0x3333333333333333;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  return true;
}

Assistant:

bool _cut(SegmentContext& segContext, vector<TrieNodeInfo>& res)const
            {
                uint i = 0;
                while(i < segContext.size())
                {
                    const TrieNodeInfo* p = segContext[i].pInfo;
                    if(p)
                    {
                        res.push_back(*p);
                        i += p->word.size();
                    }
                    else//single chinese word
                    {
                        TrieNodeInfo nodeInfo;
                        nodeInfo.word.push_back(segContext[i].uniCh);
                        nodeInfo.freq = 0;
                        nodeInfo.logFreq = _trie.getMinLogFreq();
                        res.push_back(nodeInfo);
                        i++;
                    }
                }
                return true;
            }